

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgemv.c
# Opt level: O3

void zgemv_(char *trans,integer *m,integer *n,doublecomplex *alpha,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx,doublecomplex *beta,doublecomplex *y,integer *incy)

{
  double *pdVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  doublecomplex dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  doublecomplex *pdVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint *puVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  doublecomplex *pdVar23;
  integer *piVar24;
  long lVar25;
  doublecomplex *pdVar26;
  long lVar27;
  int *piVar28;
  ulong uVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  doublecomplex z__3;
  ulong local_c8;
  double dStack_c0;
  doublecomplex local_98;
  ulong local_80;
  ulong local_78;
  doublecomplex *local_70;
  int *local_68;
  doublecomplex *local_60;
  integer *local_58;
  uint *local_50;
  doublecomplex *local_48;
  double *local_40;
  doublecomplex *local_38;
  
  bVar3 = *trans;
  local_78 = (ulong)bVar3;
  if ((bVar3 - 0x43 < 0x12) && ((0x20801U >> (bVar3 - 0x43 & 0x1f) & 1) != 0)) {
    uVar4 = *m;
    uVar29 = (ulong)uVar4;
    if ((int)uVar4 < 0) {
      local_98.r._0_4_ = 2;
    }
    else {
      iVar22 = *n;
      if (iVar22 < 0) {
        local_98.r._0_4_ = 3;
      }
      else {
        iVar20 = *lda;
        if (iVar20 < (int)(uVar4 + (uVar4 == 0))) {
          local_98.r._0_4_ = 6;
        }
        else {
          iVar18 = *incx;
          uVar21 = (ulong)iVar18;
          if (uVar21 == 0) {
            local_98.r._0_4_ = 8;
          }
          else {
            iVar15 = *incy;
            local_c8 = (ulong)iVar15;
            if (local_c8 != 0) {
              if (iVar22 == 0 || uVar4 == 0) {
                return;
              }
              if ((((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) &&
                   ((!NAN(alpha->i) && (beta->r == 1.0)))) && (!NAN(beta->r))) &&
                 ((beta->i == 0.0 && (!NAN(beta->i))))) {
                return;
              }
              puVar16 = (uint *)n;
              if (bVar3 == 0x4e) {
                puVar16 = (uint *)m;
              }
              uVar17 = *puVar16;
              uVar19 = (ulong)uVar17;
              iVar13 = 1;
              if (iVar18 < 1) {
                piVar24 = m;
                if (bVar3 == 0x4e) {
                  piVar24 = n;
                }
                iVar13 = 1 - (*piVar24 + -1) * iVar18;
              }
              iVar14 = 1 - (uVar17 - 1) * iVar15;
              if (0 < iVar15) {
                iVar14 = 1;
              }
              dVar31 = beta->r;
              local_70 = a;
              local_68 = lda;
              local_58 = n;
              local_50 = (uint *)m;
              if ((((dVar31 != 1.0) || (NAN(dVar31))) || (beta->i != 0.0)) || (NAN(beta->i))) {
                if (iVar15 == 1) {
                  if (((dVar31 != 0.0) || (NAN(dVar31))) || ((beta->i != 0.0 || (NAN(beta->i))))) {
                    if (0 < (int)uVar17) {
                      lVar12 = 0;
                      do {
                        dVar31 = beta->r;
                        dVar2 = beta->i;
                        pdVar1 = (double *)((long)&y->r + lVar12);
                        dVar32 = *pdVar1;
                        dVar9 = pdVar1[1];
                        pdVar1 = (double *)((long)&y->r + lVar12);
                        *pdVar1 = dVar31 * dVar32 + dVar9 * -dVar2;
                        pdVar1[1] = dVar31 * dVar9 + dVar32 * dVar2;
                        lVar12 = lVar12 + 0x10;
                      } while (uVar19 << 4 != lVar12);
                    }
                  }
                  else if (0 < (int)uVar17) {
                    memset(y,0,uVar19 << 4);
                  }
                }
                else if (((dVar31 != 0.0) || (NAN(dVar31))) || ((beta->i != 0.0 || (NAN(beta->i)))))
                {
                  if (0 < (int)uVar17) {
                    pdVar11 = y + (long)iVar14 + -1;
                    do {
                      dVar31 = beta->r;
                      dVar2 = beta->i;
                      dVar32 = pdVar11->r;
                      pdVar11->r = dVar31 * dVar32 + pdVar11->i * -dVar2;
                      pdVar11->i = dVar31 * pdVar11->i + dVar32 * dVar2;
                      pdVar11 = pdVar11 + local_c8;
                      uVar17 = (int)uVar19 - 1;
                      uVar19 = (ulong)uVar17;
                    } while (uVar17 != 0);
                  }
                }
                else if (0 < (int)uVar17) {
                  pdVar11 = y + (long)iVar14 + -1;
                  do {
                    pdVar11->r = 0.0;
                    pdVar11->i = 0.0;
                    pdVar11 = pdVar11 + local_c8;
                    uVar17 = (int)uVar19 - 1;
                    uVar19 = (ulong)uVar17;
                  } while (uVar17 != 0);
                }
              }
              pdVar11 = local_70;
              if ((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) && (!NAN(alpha->i))
                 ) {
                return;
              }
              if (*trans == 'N') {
                if (iVar15 == 1) {
                  lVar12 = (long)iVar13;
                  iVar15 = 0;
                  iVar18 = 1;
                  do {
                    dVar31 = x[lVar12 + -1].r;
                    dVar2 = x[lVar12 + -1].i;
                    if (((dVar31 != 0.0) || (NAN(dVar31))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
                      dVar32 = alpha->r * dVar31 - dVar2 * alpha->i;
                      dVar31 = alpha->r * dVar2 + dVar31 * alpha->i;
                      lVar27 = 0;
                      lVar25 = (ulong)(uVar4 + 1) - 1;
                      do {
                        pdVar1 = (double *)((long)&local_70[iVar15].r + lVar27);
                        dVar9 = *pdVar1;
                        dVar10 = pdVar1[1];
                        pdVar1 = (double *)((long)&y->r + lVar27);
                        dVar2 = pdVar1[1] + dVar10 * dVar32 + dVar9 * dVar31;
                        auVar5._8_4_ = SUB84(dVar2,0);
                        auVar5._0_8_ = *pdVar1 + dVar9 * dVar32 + dVar10 * -dVar31;
                        auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
                        *(undefined1 (*) [16])((long)&y->r + lVar27) = auVar5;
                        lVar27 = lVar27 + 0x10;
                        lVar25 = lVar25 + -1;
                      } while (lVar25 != 0);
                    }
                    lVar12 = lVar12 + uVar21;
                    iVar15 = iVar15 + iVar20;
                    bVar30 = iVar18 != iVar22;
                    iVar18 = iVar18 + 1;
                  } while (bVar30);
                  return;
                }
                lVar12 = (long)iVar13;
                iVar15 = 0;
                iVar18 = 1;
                do {
                  dVar31 = x[lVar12 + -1].r;
                  dVar2 = x[lVar12 + -1].i;
                  if (((dVar31 != 0.0) || (NAN(dVar31))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
                    pdVar26 = local_70 + iVar15;
                    dVar32 = alpha->r * dVar31 - dVar2 * alpha->i;
                    dVar31 = alpha->r * dVar2 + dVar31 * alpha->i;
                    lVar25 = (ulong)(uVar4 + 1) - 1;
                    pdVar11 = y + (long)iVar14 + -1;
                    do {
                      dVar2 = pdVar11->i + pdVar26->i * dVar32 + pdVar26->r * dVar31;
                      dVar6.i._0_4_ = SUB84(dVar2,0);
                      dVar6.r = pdVar11->r + pdVar26->r * dVar32 + pdVar26->i * -dVar31;
                      dVar6.i._4_4_ = (int)((ulong)dVar2 >> 0x20);
                      *pdVar11 = dVar6;
                      pdVar26 = pdVar26 + 1;
                      pdVar11 = pdVar11 + local_c8;
                      lVar25 = lVar25 + -1;
                    } while (lVar25 != 0);
                  }
                  lVar12 = lVar12 + uVar21;
                  iVar15 = iVar15 + iVar20;
                  bVar30 = iVar18 != iVar22;
                  iVar18 = iVar18 + 1;
                } while (bVar30);
                return;
              }
              local_60 = alpha;
              if (iVar18 != 1) {
                pdVar26 = y + -1;
                local_40 = &local_70->i;
                local_48 = x + (long)iVar13 + -1;
                local_80 = 1;
                iVar20 = 0;
                piVar28 = local_68;
                uVar19 = local_78;
                local_38 = pdVar26;
                do {
                  if ((char)uVar19 == 'T') {
                    if ((int)uVar29 < 1) {
LAB_0011fd16:
                      dVar31 = 0.0;
                      dStack_c0 = 0.0;
                    }
                    else {
                      lVar12 = (long)*piVar28 * (long)iVar20;
                      dVar31 = 0.0;
                      dStack_c0 = 0.0;
                      lVar25 = 0;
                      pdVar23 = local_48;
                      do {
                        dVar2 = *(double *)((long)local_40 + lVar25 + lVar12 * 0x10 + -8);
                        dVar32 = *(double *)((long)local_40 + lVar25 + lVar12 * 0x10);
                        dVar31 = dVar31 + dVar2 * pdVar23->r + pdVar23->i * -dVar32;
                        dStack_c0 = dStack_c0 + dVar2 * pdVar23->i + pdVar23->r * dVar32;
                        lVar25 = lVar25 + 0x10;
                        pdVar23 = pdVar23 + (int)uVar21;
                      } while (uVar29 << 4 != lVar25);
                    }
                  }
                  else {
                    if ((int)uVar29 < 1) goto LAB_0011fd16;
                    dVar31 = 0.0;
                    dStack_c0 = 0.0;
                    lVar12 = 0;
                    iVar22 = iVar13;
                    do {
                      auVar8._8_4_ = SUB84(dStack_c0,0);
                      auVar8._0_8_ = dVar31;
                      auVar8._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                      d_cnjg(&local_98,pdVar11 + (long)*piVar28 * (long)iVar20 + lVar12);
                      dStack_c0 = auVar8._8_8_;
                      dVar2 = x[(long)iVar22 + -1].r;
                      dVar32 = x[(long)iVar22 + -1].i;
                      dVar31 = dVar31 + (double)CONCAT44(local_98.r._4_4_,local_98.r._0_4_) * dVar2
                                        + dVar32 * -local_98.i;
                      dStack_c0 = dStack_c0 +
                                  (double)CONCAT44(local_98.r._4_4_,local_98.r._0_4_) * dVar32 +
                                  dVar2 * local_98.i;
                      uVar21 = (ulong)(uint)*incx;
                      iVar22 = iVar22 + *incx;
                      uVar29 = (ulong)*local_50;
                      lVar12 = lVar12 + 1;
                      pdVar11 = local_70;
                      piVar28 = local_68;
                    } while ((int)lVar12 < (int)*local_50);
                    local_c8 = (ulong)(uint)*incy;
                    iVar22 = *local_58;
                    uVar19 = local_78;
                    alpha = local_60;
                    pdVar26 = local_38;
                  }
                  dVar2 = alpha->r;
                  dVar32 = alpha->i;
                  dVar9 = pdVar26[iVar14].i;
                  pdVar26[iVar14].r = pdVar26[iVar14].r + dVar2 * dVar31 + dStack_c0 * -dVar32;
                  pdVar26[iVar14].i = dVar9 + dVar2 * dStack_c0 + dVar31 * dVar32;
                  iVar14 = iVar14 + (int)local_c8;
                  iVar18 = (int)local_80;
                  iVar20 = iVar20 + 1;
                  local_80 = (ulong)(iVar18 + 1);
                  if (iVar22 <= iVar18) {
                    return;
                  }
                } while( true );
              }
              local_80 = 1;
              iVar20 = 0;
              pdVar26 = local_70;
              piVar28 = local_68;
              uVar21 = local_78;
              do {
                if ((char)uVar21 == 'T') {
                  if ((int)uVar29 < 1) {
LAB_0011f9ac:
                    dVar31 = 0.0;
                    dStack_c0 = 0.0;
                  }
                  else {
                    dVar31 = 0.0;
                    dStack_c0 = 0.0;
                    lVar12 = 0;
                    do {
                      dVar2 = *(double *)((long)&pdVar11[(long)iVar20 * (long)*piVar28].r + lVar12);
                      dVar32 = *(double *)((long)&pdVar11[(long)iVar20 * (long)*piVar28].i + lVar12)
                      ;
                      pdVar1 = (double *)((long)&x->r + lVar12);
                      dVar9 = *pdVar1;
                      dVar10 = pdVar1[1];
                      dVar31 = dVar31 + dVar2 * dVar9 + dVar10 * -dVar32;
                      dStack_c0 = dStack_c0 + dVar2 * dVar10 + dVar9 * dVar32;
                      lVar12 = lVar12 + 0x10;
                    } while ((uVar29 & 0xffffffff) << 4 != lVar12);
                  }
                }
                else {
                  if ((int)uVar29 < 1) goto LAB_0011f9ac;
                  dVar31 = 0.0;
                  dStack_c0 = 0.0;
                  lVar12 = 0;
                  pdVar23 = x;
                  do {
                    auVar7._8_4_ = SUB84(dStack_c0,0);
                    auVar7._0_8_ = dVar31;
                    auVar7._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                    d_cnjg(&local_98,pdVar26 + (long)*piVar28 * (long)iVar20);
                    dStack_c0 = auVar7._8_8_;
                    dVar31 = dVar31 + (double)CONCAT44(local_98.r._4_4_,local_98.r._0_4_) *
                                      pdVar23->r + pdVar23->i * -local_98.i;
                    dStack_c0 = dStack_c0 +
                                (double)CONCAT44(local_98.r._4_4_,local_98.r._0_4_) * pdVar23->i +
                                pdVar23->r * local_98.i;
                    uVar29 = (ulong)(int)*local_50;
                    lVar12 = lVar12 + 1;
                    pdVar26 = pdVar26 + 1;
                    pdVar23 = pdVar23 + 1;
                    piVar28 = local_68;
                  } while (lVar12 < (long)uVar29);
                  local_c8 = (ulong)(uint)*incy;
                  iVar22 = *local_58;
                  pdVar26 = local_70;
                  uVar21 = local_78;
                  alpha = local_60;
                }
                dVar2 = alpha->r;
                dVar32 = alpha->i;
                dVar9 = y[(long)iVar14 + -1].i;
                y[(long)iVar14 + -1].r =
                     y[(long)iVar14 + -1].r + dVar2 * dVar31 + dStack_c0 * -dVar32;
                y[(long)iVar14 + -1].i = dVar9 + dVar2 * dStack_c0 + dVar31 * dVar32;
                iVar14 = iVar14 + (int)local_c8;
                iVar18 = (int)local_80;
                iVar20 = iVar20 + 1;
                local_80 = (ulong)(iVar18 + 1);
                if (iVar22 <= iVar18) {
                  return;
                }
              } while( true );
            }
            local_98.r._0_4_ = 0xb;
          }
        }
      }
    }
  }
  else {
    local_98.r._0_4_ = 1;
  }
  input_error("ZGEMV ",(int *)&local_98);
  return;
}

Assistant:

void zgemv_(char *trans, integer *m, integer *n, 
	doublecomplex *alpha, doublecomplex *a, integer *lda, doublecomplex *
	x, integer *incx, doublecomplex *beta, doublecomplex *y, integer *
	incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer lenx, leny, i, j;
    integer ix, iy, jx, jy, kx, ky;
    logical noconj;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZGEMV  performs one of the matrix-vector operations   

       y := alpha*A*x + beta*y,   or   y := alpha*A'*x + beta*y,   or   

       y := alpha*conjg( A' )*x + beta*y,   

    where alpha and beta are scalars, x and y are vectors and A is an   
    m by n matrix.   

    Parameters   
    ==========   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the operation to be performed as   
             follows:   

                TRANS = 'N' or 'n'   y := alpha*A*x + beta*y.   

                TRANS = 'T' or 't'   y := alpha*A'*x + beta*y.   

                TRANS = 'C' or 'c'   y := alpha*conjg( A' )*x + beta*y.   

             Unchanged on exit.   

    M      - INTEGER.   
             On entry, M specifies the number of rows of the matrix A.   
             M must be at least zero.   
             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the number of columns of the matrix A. 
  
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry, the leading m by n part of the array A must   
             contain the matrix of coefficients.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, m ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( n - 1 )*abs( INCX ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( m - 1 )*abs( INCX ) ) otherwise.   
             Before entry, the incremented array X must contain the   
             vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    BETA   - COMPLEX*16      .   
             On entry, BETA specifies the scalar beta. When BETA is   
             supplied as zero then Y need not be set on input.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( m - 1 )*abs( INCY ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( n - 1 )*abs( INCY ) ) otherwise.   
             Before entry with BETA non-zero, the incremented array Y   
             must contain the vector y. On exit, Y is overwritten by the 
  
             updated vector y.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   

       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
	 strncmp(trans, "C", 1)!=0 ) {
	info = 1;
    } else if (*m < 0) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*lda < max(1,*m)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    } else if (*incy == 0) {
	info = 11;
    }
    if (info != 0) {
	input_error("ZGEMV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (alpha->r == 0. && alpha->i == 0.
			       && beta->r == 1. && beta->i == 0.)) {
	return;
    }

    noconj = ( strncmp(trans, "T", 1)==0 );

/*     Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */

    if (strncmp(trans, "N", 1)==0) {
	lenx = *n;
	leny = *m;
    } else {
	lenx = *m;
	leny = *n;
    }
    if (*incx > 0) {
	kx = 1;
    } else {
	kx = 1 - (lenx - 1) * *incx;
    }
    if (*incy > 0) {
	ky = 1;
    } else {
	ky = 1 - (leny - 1) * *incy;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A.   

       First form  y := beta*y. */

    if (beta->r != 1. || beta->i != 0.) {
	if (*incy == 1) {
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(i).r = 0., Y(i).i = 0.;
/* L10: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(i).r - beta->i * Y(i).i, 
			    z__1.i = beta->r * Y(i).i + beta->i * Y(i)
			    .r;
		    Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L20: */
		}
	    }
	} else {
	    iy = ky;
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(iy).r = 0., Y(iy).i = 0.;
		    iy += *incy;
/* L30: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(iy).r - beta->i * Y(iy).i, 
			    z__1.i = beta->r * Y(iy).i + beta->i * Y(iy)
			    .r;
		    Y(iy).r = z__1.r, Y(iy).i = z__1.i;
		    iy += *incy;
/* L40: */
		}
	    }
	}
    }
    if (alpha->r == 0. && alpha->i == 0.) {
	return;
    }
    if (strncmp(trans, "N", 1)==0) {

/*        Form  y := alpha*A*x + y. */

	jx = kx;
	if (*incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(i).r + z__2.r, z__1.i = Y(i).i + 
				z__2.i;
			Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L50: */
		    }
		}
		jx += *incx;
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    iy = ky;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(iy).r + z__2.r, z__1.i = Y(iy).i + 
				z__2.i;
			Y(iy).r = z__1.r, Y(iy).i = z__1.i;
			iy += *incy;
/* L70: */
		    }
		}
		jx += *incx;
/* L80: */
	    }
	}
    } else {

/*        Form  y := alpha*A'*x + y  or  y := alpha*conjg( A' )*x + y.
 */

	jy = ky;
	if (*incx == 1) {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(i)
				.i, z__2.i = A(i,j).r * X(i).i + A(i,j)
				.i * X(i).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				z__2.i = z__3.r * X(i).i + z__3.i * X(i)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L110: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		ix = kx;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(ix)
				.i, z__2.i = A(i,j).r * X(ix).i + A(i,j)
				.i * X(ix).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L120: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				z__2.i = z__3.r * X(ix).i + z__3.i * X(ix)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L130: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L140: */
	    }
	}
    }

    return;

/*     End of ZGEMV . */

}